

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int omega(int n)

{
  int iVar1;
  int local_b8 [2];
  int factor [20];
  int power [20];
  int nleft;
  int nfactor;
  
  if (n < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    if ((n != 1) &&
       (i4_factor(n,0x14,power + 0x13,local_b8,factor + 0x12,power + 0x12), iVar1 = power[0x13],
       power[0x12] != 1)) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"OMEGA - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  Not enough factorization space.\n");
      exit(1);
    }
  }
  return iVar1;
}

Assistant:

int omega ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    OMEGA returns OMEGA(N), the number of distinct prime divisors of N.
//
//  Discussion:
//
//    If N = 1, then
//
//      OMEGA(N) = 1
//
//    else if the prime factorization of N is
//
//      N = P1**E1 * P2^E2 * ... * PM^EM,
//
//    then
//
//      OMEGA(N) = M
//
//  First values:
//
//     N   OMEGA(N)
//
//     1    1
//     2    1
//     3    1
//     4    1
//     5    1
//     6    2
//     7    1
//     8    1
//     9    1
//    10    2
//    11    1
//    12    2
//    13    1
//    14    2
//    15    2
//    16    1
//    17    1
//    18    2
//    19    1
//    20    2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 November 2000
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the value to be analyzed.  N must be 1 or
//    greater.
//
//    Output, int OMEGA, the value of OMEGA(N).  But if N is 0 or
//    less, OMEGA is returned as 0, a nonsense value.  If there is
//    not enough room for factoring, OMEGA is returned as -1.
//
{
# define FACTOR_MAX 20

  int factor[FACTOR_MAX];
  int nfactor;
  int nleft;
  int power[FACTOR_MAX];

  if ( n <= 0 )
  {
    return 0;
  }

  if ( n == 1 )
  {
    return 1;
  }
//
//  Factor N.
//
  i4_factor ( n, FACTOR_MAX, nfactor, factor, power, nleft );

  if ( nleft != 1 )
  {
    std::cerr << "\n";
    std::cerr << "OMEGA - Fatal error!\n";
    std::cerr << "  Not enough factorization space.\n";
    exit ( 1 );
  }

  return nfactor;

# undef FACTOR_MAX
}